

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawAddClampColumnP_C(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  BYTE *pBVar5;
  int iVar6;
  byte *pbVar7;
  fixed_t fVar8;
  long lVar9;
  uint uVar10;
  
  pBVar5 = dc_source;
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  if (0 < dc_count) {
    lVar9 = (long)dc_pitch;
    pbVar7 = dc_dest;
    iVar6 = dc_count;
    fVar8 = dc_texturefrac;
    do {
      uVar10 = pDVar4[*pbVar7] + pDVar3[plVar1[pBVar5[fVar8 >> 0x10]]] & 0x40100400;
      uVar10 = uVar10 - (uVar10 >> 5) |
               pDVar4[*pbVar7] + pDVar3[plVar1[pBVar5[fVar8 >> 0x10]]] & 0x3e0f83e0 | 0x1f07c1f;
      *pbVar7 = RGB32k.All[uVar10 >> 0xf & uVar10];
      pbVar7 = pbVar7 + lVar9;
      fVar8 = fVar8 + fVar2;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

void R_DrawAddClampColumnP_C ()
{
	int count;
	BYTE *dest;
	fixed_t frac;
	fixed_t fracstep;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;

	fracstep = dc_iscale;
	frac = dc_texturefrac;

	{
		BYTE *colormap = dc_colormap;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;
		DWORD *fg2rgb = dc_srcblend;
		DWORD *bg2rgb = dc_destblend;

		do
		{
			DWORD a = fg2rgb[colormap[source[frac>>FRACBITS]]] + bg2rgb[*dest];
			DWORD b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			*dest = RGB32k.All[a & (a>>15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}
}